

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  tVertex pVVar6;
  tFace pFVar7;
  double *pdVar8;
  size_t sVar9;
  tEdge pEVar10;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  int i;
  HalfEdge *pHVar11;
  long lVar12;
  string *this_00;
  string s;
  Point p;
  char line [2048];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  Solid *local_880;
  undefined1 *local_878 [2];
  undefined1 local_868 [16];
  Point local_858;
  double local_840;
  char local_838 [2056];
  
  __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = fprintf(_stderr,"Error is opening file %s\n",(char *)CONCAT44(in_register_00000034,__fd)
                   );
    return CONCAT44(extraout_var,iVar1);
  }
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    local_880 = this;
    do {
      fgets(local_838,0x800,__stream);
      iVar1 = feof(__stream);
      if ((iVar1 != 0) || (local_838[0] == '\0')) break;
      pcVar5 = strtok(local_838," \r\n\t");
      iVar1 = strcmp(pcVar5,"Vertex");
      if (iVar1 == 0) {
        iVar2 = 0;
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar1 = atoi(pcVar5);
        local_858.v[0] = 0.0;
        local_858.v[1] = 0.0;
        local_858.v[2] = 0.0;
        do {
          pcVar5 = strtok((char *)0x0," \r\n\t");
          local_840 = atof(pcVar5);
          pdVar8 = Point::operator[](&local_858,iVar2);
          *pdVar8 = local_840;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 3);
        pVVar6 = createVertex(this,iVar1);
        (pVVar6->m_point).v[2] = local_858.v[2];
        (pVVar6->m_point).v[0] = local_858.v[0];
        (pVVar6->m_point).v[1] = local_858.v[1];
        pVVar6->m_id = iVar1;
        pcVar5 = strtok((char *)0x0,"\r\n\t");
        if (pcVar5 != (char *)0x0) {
          local_8a0[0] = local_890;
          sVar9 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,pcVar5,pcVar5 + sVar9)
          ;
          uVar3 = std::__cxx11::string::find((char *)local_8a0,0x1156a0,0);
          uVar4 = std::__cxx11::string::find((char *)local_8a0,0x1156f6,0);
          this = local_880;
          if (-1 < (int)(uVar4 | uVar3)) {
            std::__cxx11::string::substr((ulong)local_878,(ulong)local_8a0);
            this_00 = (string *)&pVVar6->m_string;
            goto LAB_001105e1;
          }
          goto LAB_00110600;
        }
      }
      else {
        iVar1 = strcmp(pcVar5,"Face");
        if (iVar1 == 0) {
          pcVar5 = strtok((char *)0x0," \r\n\t");
          iVar1 = atoi(pcVar5);
          lVar12 = 0;
          do {
            pcVar5 = strtok((char *)0x0," \r\n\t");
            iVar2 = atoi(pcVar5);
            *(int *)((long)local_858.v + lVar12 * 4) = iVar2;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          pFVar7 = createFace(this,(int *)&local_858,iVar1);
          pcVar5 = strtok((char *)0x0,"\r\n\t");
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) goto LAB_00110619;
          local_8a0[0] = local_890;
          sVar9 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,pcVar5,pcVar5 + sVar9)
          ;
          uVar3 = std::__cxx11::string::find((char *)local_8a0,0x1156a0,0);
          uVar4 = std::__cxx11::string::find((char *)local_8a0,0x1156f6,0);
          this = local_880;
          if (-1 < (int)(uVar4 | uVar3)) {
            std::__cxx11::string::substr((ulong)local_878,(ulong)local_8a0);
            this_00 = (string *)&pFVar7->m_string;
            goto LAB_001105e1;
          }
        }
        else {
          iVar1 = strcmp(pcVar5,"Edge");
          if (iVar1 == 0) {
            pcVar5 = strtok((char *)0x0," \r\n\t");
            iVar1 = atoi(pcVar5);
            pcVar5 = strtok((char *)0x0," \r\n\t");
            iVar2 = atoi(pcVar5);
            pEVar10 = idEdge(this,iVar1,iVar2);
            pcVar5 = strtok((char *)0x0,"\r\n\t");
            std::__cxx11::string::string((string *)local_8a0,pcVar5,(allocator *)local_878);
            uVar3 = std::__cxx11::string::find((char *)local_8a0,0x1156a0,0);
            uVar4 = std::__cxx11::string::find((char *)local_8a0,0x1156f6,0);
            this = local_880;
            if (-1 < (int)(uVar4 | uVar3)) {
              std::__cxx11::string::substr((ulong)local_878,(ulong)local_8a0);
              this_00 = (string *)&pEVar10->m_string;
LAB_001105e1:
              std::__cxx11::string::operator=(this_00,(string *)local_878);
              if (local_878[0] != local_868) {
                operator_delete(local_878[0]);
              }
            }
          }
          else {
            iVar1 = strcmp(pcVar5,"Corner");
            if (iVar1 != 0) goto LAB_00110619;
            pcVar5 = strtok((char *)0x0," \r\n\t");
            iVar1 = atoi(pcVar5);
            pcVar5 = strtok((char *)0x0," \r\n\t");
            iVar2 = atoi(pcVar5);
            pVVar6 = idVertex(this,iVar1);
            pFVar7 = idFace(this,iVar2);
            pHVar11 = pFVar7->m_halfedge;
            do {
              if (pHVar11->m_vertex == pVVar6) goto LAB_00110277;
              pHVar11 = pHVar11->m_next;
            } while (pHVar11 != pFVar7->m_halfedge);
            pHVar11 = (HalfEdge *)0x0;
LAB_00110277:
            pcVar5 = strtok((char *)0x0,"\r\n\t");
            std::__cxx11::string::string((string *)local_8a0,pcVar5,(allocator *)local_878);
            uVar3 = std::__cxx11::string::find((char *)local_8a0,0x1156a0,0);
            uVar4 = std::__cxx11::string::find((char *)local_8a0,0x1156f6,0);
            this = local_880;
            if (-1 < (int)(uVar4 | uVar3)) {
              std::__cxx11::string::substr((ulong)local_878,(ulong)local_8a0);
              this_00 = (string *)&pHVar11->m_string;
              goto LAB_001105e1;
            }
          }
        }
LAB_00110600:
        if (local_8a0[0] != local_890) {
          operator_delete(local_8a0[0]);
        }
      }
LAB_00110619:
      iVar1 = feof(__stream);
    } while (iVar1 == 0);
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  return extraout_RAX;
}

Assistant:

void Solid::read( const char * input ) {
	FILE * is = fopen( input, "r" );
	if( is == NULL ) {
		fprintf(stderr,"Error is opening file %s\n", input );
		return;
	}

	char line[MAX_LINE];
	int id;

	while( !feof(is)  ) {		
		fgets( line, MAX_LINE, is );
		if(  feof(is) || strlen( line ) == 0  ) break;

		char * str = strtok( line, " \r\n\t");
		if( strcmp(str, "Vertex" ) == 0 ) 
		{
			
			str = strtok(NULL," \r\n\t");

			id = atoi( str );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = strtok(NULL," \r\n\t");
				p[i] = atof( str );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			str = strtok( NULL, "\r\n\t");

			if( str == NULL ) continue;

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}
		

		if( strcmp(str,"Face") == 0 ) {
			str = strtok(NULL, " \r\n\t");

			id = atoi( str );
			
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = strtok(NULL," \r\n\t");
				v[i] = atoi( str );
			}

			tFace f = createFace( v, id );
			
			str = strtok( NULL, "\r\n\t");
			if ( str== NULL || strlen( str ) == 0 ) continue;

			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( strcmp(str,"Edge")==0 ) {
			str = strtok(NULL, " \r\n\t");
			int id0 = atoi( str );

			str = strtok(NULL, " \r\n\t");
			int id1 = atoi( str );

			tEdge edge = idEdge( id0, id1 );
			

			str = strtok(NULL, "\r\n\t");

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( strcmp(str,"Corner")==0 ) {
			str = strtok(NULL," \r\n\t");
			int id0 = atoi( str );
				
			str = strtok(NULL," \r\n\t");
			int id1 = atoi( str );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = strtok(NULL,"\r\n\t");
			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	
	labelBoundaryEdges();
	removeDanglingVertices();


}